

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iptables_ext.c
# Opt level: O1

int parse_reject(void *data,char **str)

{
  int iVar1;
  char *__s1;
  char *src;
  double __x;
  
  __s1 = strtok((char *)0x0," \t\n");
  if (__s1 == (char *)0x0) {
    src = "icmp-port-unreachable";
  }
  else {
    src = strtok((char *)0x0," \t\n");
    if (src == (char *)0x0) {
      _log(__x);
      return -1;
    }
    iVar1 = strcmp(__s1,"--reject-with");
    if (iVar1 != 0) {
      return 0;
    }
  }
  _strlcpy((char *)data,src,0x20);
  return 0;
}

Assistant:

static int parse_reject(void *data, char **str)
{
	target_reject_t *m = (target_reject_t *)data;

	char *p = *str;
	char *q = NULL;

	p = strtok(NULL, " \t\n");

	if (p == NULL) {
		_strlcpy(m->with, "icmp-port-unreachable", sizeof(m->with));
		return 0;
	}

	q = p;
	q = strtok(NULL, " \t\n");

	if (q == NULL) {
		log_err("opt \"%s\" arg is null", p);
		goto err;
	}

	if (strcmp(p, "--reject-with") == 0) {
		_strlcpy(m->with, q, sizeof(m->with));
	}

	p = q;
	return 0;
err:
	return -1;
}